

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

Type * slang::ast::Type::fromSyntax
                 (Compilation *compilation,Type *elementType,
                 SyntaxList<slang::syntax::VariableDimensionSyntax> *dimensions,ASTContext *context)

{
  PointerIntPair<const_slang::syntax::SyntaxNode_*,_1U,_1U,_bool> syntax;
  DeferredSourceRange sourceRange;
  Type *pTVar1;
  Diagnostic *diag;
  size_t sVar2;
  bool bVar3;
  SourceRange sourceRange_00;
  EvaluatedDimension dim;
  bool local_71;
  Compilation *local_70;
  EvaluatedDimension local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  VariableDimensionSyntax *local_38;
  
  if ((dimensions->super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>).
      _M_extent._M_extent_value != 0) {
    local_70 = compilation;
    pTVar1 = getCanonicalType(elementType);
    if ((2 < (pTVar1->super_Symbol).kind - UntypedType) ||
       (((context->flags).m_bits & 0x80000000) != 0)) {
      sVar2 = (dimensions->
              super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>).
              _M_extent._M_extent_value;
switchD_00271003_default:
      bVar3 = sVar2 == 0;
      sVar2 = sVar2 - 1;
      if (bVar3) {
        return &((AssociativeArrayType *)elementType)->super_Type;
      }
      bVar3 = isError(elementType);
      if (bVar3) {
        return &((AssociativeArrayType *)elementType)->super_Type;
      }
      syntax.value = (uintptr_t)
                     (dimensions->
                     super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>).
                     _M_ptr[sVar2];
      ASTContext::evalDimension
                (&local_68,context,(VariableDimensionSyntax *)syntax.value,false,false);
      switch(local_68.kind) {
      case Unknown:
        goto switchD_00271003_caseD_0;
      case Range:
      case AbbreviatedRange:
        local_48 = 0;
        uStack_40 = 0;
        sourceRange.node.value = syntax.value;
        sourceRange.range = (SourceRange)ZEXT816(0);
        local_38 = (VariableDimensionSyntax *)syntax.value;
        elementType = FixedSizeUnpackedArrayType::fromDim
                                ((context->scope).ptr,elementType,local_68.range,sourceRange);
        goto switchD_00271003_default;
      case Dynamic:
        elementType = &BumpAllocator::emplace<slang::ast::DynamicArrayType,slang::ast::Type_const&>
                                 (&local_70->super_BumpAllocator,elementType)->super_Type;
        break;
      case Associative:
        elementType = &BumpAllocator::
                       emplace<slang::ast::AssociativeArrayType,slang::ast::Type_const&,slang::ast::Type_const*&>
                                 (&local_70->super_BumpAllocator,elementType,
                                  &local_68.associativeType)->super_Type;
        break;
      case Queue:
        elementType = &BumpAllocator::
                       emplace<slang::ast::QueueType,slang::ast::Type_const&,unsigned_int&>
                                 (&local_70->super_BumpAllocator,elementType,&local_68.queueMaxSize)
                       ->super_Type;
        break;
      case DPIOpenArray:
        local_71 = false;
        elementType = &BumpAllocator::
                       emplace<slang::ast::DPIOpenArrayType,slang::ast::Type_const&,bool>
                                 (&local_70->super_BumpAllocator,elementType,&local_71)->super_Type;
        break;
      default:
        goto switchD_00271003_default;
      }
      (((AssociativeArrayType *)elementType)->super_Type).super_Symbol.originatingSyntax =
           (SyntaxNode *)syntax.value;
      goto switchD_00271003_default;
    }
    sourceRange_00 =
         slang::syntax::SyntaxNode::sourceRange
                   (&(dimensions->super_SyntaxListBase).super_SyntaxNode);
    diag = ASTContext::addDiag(context,(DiagCode)0xb0009,sourceRange_00);
    ast::operator<<(diag,elementType);
switchD_00271003_caseD_0:
    elementType = local_70->errorType;
  }
  return elementType;
}

Assistant:

const Type& Type::fromSyntax(Compilation& compilation, const Type& elementType,
                             const SyntaxList<VariableDimensionSyntax>& dimensions,
                             const ASTContext& context) {
    if (dimensions.empty())
        return elementType;

    switch (elementType.getCanonicalType().kind) {
        case SymbolKind::SequenceType:
        case SymbolKind::PropertyType:
        case SymbolKind::UntypedType:
            if (!context.flags.has(ASTFlags::AllowInterconnect)) {
                context.addDiag(diag::InvalidArrayElemType, dimensions.sourceRange())
                    << elementType;
                return compilation.getErrorType();
            }
            break;
        default:
            break;
    }

    const Type* result = &elementType;
    size_t count = dimensions.size();
    for (size_t i = 0; i < count; i++) {
        if (result->isError())
            return *result;

        auto& syntax = *dimensions[count - i - 1];
        auto dim = context.evalDimension(syntax, /* requireRange */ false, /* isPacked */ false);

        switch (dim.kind) {
            case DimensionKind::Unknown:
                return compilation.getErrorType();
            case DimensionKind::Range:
            case DimensionKind::AbbreviatedRange:
                result = &FixedSizeUnpackedArrayType::fromDim(*context.scope, *result, dim.range,
                                                              syntax);
                break;
            case DimensionKind::Dynamic: {
                auto next = compilation.emplace<DynamicArrayType>(*result);
                next->setSyntax(syntax);
                result = next;
                break;
            }
            case DimensionKind::DPIOpenArray: {
                auto next = compilation.emplace<DPIOpenArrayType>(*result, /* isPacked */ false);
                next->setSyntax(syntax);
                result = next;
                break;
            }
            case DimensionKind::Associative: {
                auto next = compilation.emplace<AssociativeArrayType>(*result, dim.associativeType);
                next->setSyntax(syntax);
                result = next;
                break;
            }
            case DimensionKind::Queue: {
                auto next = compilation.emplace<QueueType>(*result, dim.queueMaxSize);
                next->setSyntax(syntax);
                result = next;
                break;
            }
        }
    }

    return *result;
}